

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

string * __thiscall
ftxui::Screen::ResetPosition_abi_cxx11_(string *__return_storage_ptr__,Screen *this,bool clear)

{
  undefined3 in_register_00000011;
  int y;
  int iVar1;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (CONCAT31(in_register_00000011,clear) == 0) {
    std::operator<<(local_1a8,"\r");
    for (iVar1 = 1; iVar1 < this->dimy_; iVar1 = iVar1 + 1) {
      std::operator<<(local_1a8,"\x1b[1A");
    }
  }
  else {
    std::operator<<(local_1a8,"\r");
    std::operator<<(local_1a8,"\x1b[2K");
    for (iVar1 = 1; iVar1 < this->dimy_; iVar1 = iVar1 + 1) {
      std::operator<<(local_1a8,"\x1b[1A");
      std::operator<<(local_1a8,"\x1b[2K");
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Screen::ResetPosition(bool clear) const {
  std::stringstream ss;
  if (clear) {
    ss << "\r";       // MOVE_LEFT;
    ss << "\x1b[2K";  // CLEAR_SCREEN;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
      ss << "\x1B[2K";  // CLEAR_LINE;
    }
  } else {
    ss << "\r";  // MOVE_LEFT;
    for (int y = 1; y < dimy_; ++y) {
      ss << "\x1B[1A";  // MOVE_UP;
    }
  }
  return ss.str();
}